

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O2

void __thiscall
icu_63::HebrewCalendar::roll
          (HebrewCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (field == UCAL_MONTH) {
    iVar2 = Calendar::get(&this->super_Calendar,UCAL_MONTH,status);
    iVar3 = Calendar::get(&this->super_Calendar,UCAL_YEAR,status);
    iVar5 = (iVar3 * 0xc + 0x11) % 0x13;
    iVar1 = 0xc;
    if (iVar5 < 0) {
      iVar1 = -7;
    }
    iVar4 = amount % (int)(iVar5 < iVar1 ^ 0xd) + iVar2;
    if (iVar5 < iVar1) {
      if (((amount < 1) || (4 < iVar2)) || (iVar4 < 5)) {
        iVar4 = iVar4 - (uint)((5 < iVar2 && amount < 0) && iVar4 < 6);
      }
      else {
        iVar4 = iVar4 + 1;
      }
    }
    Calendar::set(&this->super_Calendar,UCAL_MONTH,(iVar4 + 0xd) % 0xd);
    (*(this->super_Calendar).super_UObject._vptr_UObject[0x2c])(this,5,status);
    return;
  }
  Calendar::roll(&this->super_Calendar,field,amount,status);
  return;
}

Assistant:

UBool HebrewCalendar::haveDefaultCentury() const
{
    return TRUE;
}